

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O3

void processAttributes(XMLAttDefList *attList,bool margin)

{
  bool bVar1;
  char cVar2;
  char *in_RAX;
  long lVar3;
  long *plVar4;
  wchar16 *pwVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  StrX local_38;
  
  local_38.fLocalForm = in_RAX;
  cVar2 = (**(code **)(*(long *)attList + 0x28))();
  if (cVar2 == '\0') {
    if (margin) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Attributes:\n",0xc);
    lVar3 = (**(code **)(*(long *)attList + 0x50))(attList);
    if (lVar3 != 0) {
      uVar8 = 0;
      uVar9 = 1;
      do {
        plVar4 = (long *)(**(code **)(*(long *)attList + 0x58))(attList,uVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tName:\t\t\t",9);
        pwVar5 = (wchar16 *)(**(code **)(*plVar4 + 0x28))(plVar4);
        pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        local_38.fLocalForm = pcVar6;
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        StrX::~StrX(&local_38);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tType:\t\t\t",9);
        pwVar5 = (wchar16 *)
                 xercesc_4_0::XMLAttDef::getAttTypeString
                           (*(AttTypes *)((long)plVar4 + 0xc),
                            xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        local_38.fLocalForm = pcVar6;
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar7);
        }
        StrX::~StrX(&local_38);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\tDefault Type:\t",0xf);
        pwVar5 = (wchar16 *)
                 xercesc_4_0::XMLAttDef::getDefAttTypeString
                           (*(DefAttTypes *)(plVar4 + 1),
                            xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar5,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        local_38.fLocalForm = pcVar6;
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar7);
        }
        StrX::~StrX(&local_38);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        if (plVar4[4] != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\tValue:\t\t\t",10);
          pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                     ((wchar16 *)plVar4[4],
                                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          local_38.fLocalForm = pcVar6;
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar7);
          }
          StrX::~StrX(&local_38);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        }
        if (plVar4[5] != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\tEnumeration:\t",0xe);
          pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                     ((wchar16 *)plVar4[5],
                                      xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          local_38.fLocalForm = pcVar6;
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b090);
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar7);
          }
          StrX::~StrX(&local_38);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        }
        processDatatypeValidator((DatatypeValidator *)plVar4[10],true);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        uVar8 = (**(code **)(*(long *)attList + 0x50))(attList);
        bVar1 = uVar9 < uVar8;
        uVar8 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void processAttributes( XMLAttDefList& attList, bool margin )
{
    if ( attList.isEmpty() )
    {
        return;
    }

    if ( margin )
    {
        std::cout << "\t";
    }

    std::cout << "Attributes:\n";
    for (unsigned int i=0; i<attList.getAttDefCount(); i++)
    {
        // Name
        SchemaAttDef& curAttDef = (SchemaAttDef&)attList.getAttDef(i);
        std::cout << "\tName:\t\t\t" << StrX(curAttDef.getFullName()) << "\n";

        // Type
        std::cout << "\tType:\t\t\t";
		std::cout << StrX(XMLAttDef::getAttTypeString(curAttDef.getType()));
        std::cout << "\n";

        // Default Type
        std::cout << "\tDefault Type:\t";
		std::cout << StrX(XMLAttDef::getDefAttTypeString(curAttDef.getDefaultType()));
        std::cout << "\n";

        // Value
        if( curAttDef.getValue() )
        {
            std::cout << "\tValue:\t\t\t";
            std::cout << StrX(curAttDef.getValue());
            std::cout << "\n";
        }

        // Enum. values
        if( curAttDef.getEnumeration() )
        {
            std::cout << "\tEnumeration:\t";
            std::cout << StrX(curAttDef.getEnumeration());
            std::cout << "\n";
        }

         const DatatypeValidator* dv = curAttDef.getDatatypeValidator();
         processDatatypeValidator( dv, true );

        std::cout << "\n";
    }
}